

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  Measurement *m_00;
  size_type sVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  Sensor *this_00;
  Sensor *this_01;
  mapped_type *ppSVar7;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar8;
  MeasurementFactory *this_02;
  istream *piVar9;
  pointer ppMVar10;
  bool bVar11;
  Measurement *m;
  MeasurementContainer measurements;
  VectorXd lidar_noise;
  VectorXd radar_noise;
  string line;
  SensorContainer sensors;
  UnscentedKalmanFilter ukf;
  ofstream out_file;
  ifstream in_file;
  Tools local_6f8 [2];
  vector<Measurement_*,_std::allocator<Measurement_*>_> local_6e8;
  DenseStorage<double,__1,__1,_1,_0> local_6c8;
  DenseStorage<double,__1,__1,_1,_0> local_6b8;
  undefined1 *local_6a8;
  undefined8 local_6a0;
  undefined1 local_698 [16];
  vector<Measurement_*,_std::allocator<Measurement_*>_> local_688;
  vector<Measurement_*,_std::allocator<Measurement_*>_> local_670;
  string local_658;
  string local_638;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
  local_618;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
  local_5e8;
  undefined1 local_5b8 [384];
  long local_438;
  filebuf local_430 [240];
  ios_base local_340 [264];
  long local_238 [65];
  
  ukf_parameters.std_a = 2.5;
  ukf_parameters.std_yawdd = 0.8;
  ukf_parameters.pred_rate = 20.0;
  ukf_parameters.debug = 0;
  ukf_parameters.type = UKFClassic;
  ukf_parameters.k = 0;
  ukf_parameters.beta = 2;
  ukf_parameters.alpha = 0.001;
  n_meas = -1;
  bVar11 = false;
  do {
    iVar4 = getopt(argc,argv,"s:b:k:t:p:n:dlra:y:");
    switch(iVar4) {
    case 0x61:
      ukf_parameters.std_a = atof(_optarg);
      break;
    case 0x62:
      ukf_parameters.beta = atoi(_optarg);
      break;
    case 100:
      ukf_parameters.debug = ukf_parameters.debug + 1;
      break;
    case 0x6b:
      ukf_parameters.k = atoi(_optarg);
      bVar11 = true;
      break;
    case 0x6c:
      use_lidar = true;
      break;
    case 0x6e:
      n_meas = atoi(_optarg);
      break;
    case 0x70:
      iVar4 = atoi(_optarg);
      ukf_parameters.pred_rate = (double)iVar4;
      break;
    case 0x72:
      use_radar = true;
      break;
    case 0x73:
      ukf_parameters.alpha = atof(_optarg);
      break;
    case 0x74:
      ukf_parameters.type = atoi(_optarg);
      break;
    case 0x79:
      ukf_parameters.std_yawdd = atof(_optarg);
      break;
    default:
      if (iVar4 == -1) {
        if (UKFScaled < ukf_parameters.type) {
          ukf_parameters.type = UKFClassic;
        }
        if (!bVar11) {
          ukf_parameters.k = (uint)(ukf_parameters.type != UKFScaled) * 3;
        }
        if ((use_lidar == false) && (use_radar == false)) {
          use_radar = true;
          use_lidar = true;
        }
        if (ukf_parameters.debug != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lidar: ",7);
          poVar5 = std::ostream::_M_insert<bool>(true);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," radar: ",8);
          poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," std_a: ",8);
          poVar5 = std::ostream::_M_insert<double>(ukf_parameters.std_a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," std_yawdd: ",0xc);
          poVar5 = std::ostream::_M_insert<double>(ukf_parameters.std_yawdd);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," measurements: ",0xf);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,n_meas);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," debug: ",8);
          plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,ukf_parameters.debug);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
        }
        sVar2 = in_filename_abi_cxx11_._M_string_length;
        if (_optind + 2 == argc) {
          pcVar1 = argv[_optind];
          strlen(pcVar1);
          std::__cxx11::string::_M_replace(0x150318,0,(char *)sVar2,(ulong)pcVar1);
          sVar2 = out_filename_abi_cxx11_._M_string_length;
          pcVar1 = argv[(long)_optind + 1];
          strlen(pcVar1);
          std::__cxx11::string::_M_replace(0x150338,0,(char *)sVar2,(ulong)pcVar1);
          if (ukf_parameters.debug != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"in file: ",9);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,in_filename_abi_cxx11_._M_dataplus._M_p,
                                in_filename_abi_cxx11_._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"out file: ",10);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,out_filename_abi_cxx11_._M_dataplus._M_p,
                                out_filename_abi_cxx11_._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
          std::ifstream::ifstream(local_238,in_filename_abi_cxx11_._M_dataplus._M_p,_S_in);
          std::ofstream::ofstream(&local_438,out_filename_abi_cxx11_._M_dataplus._M_p,_S_out);
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Cannot open input file: ",0x18);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,in_filename_abi_cxx11_._M_dataplus._M_p,
                                in_filename_abi_cxx11_._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          else {
            cVar3 = std::__basic_file<char>::is_open();
            if (cVar3 != '\0') {
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_6b8,3,3,1);
              local_5b8._8_8_ = 0.0;
              local_5b8._16_8_ = 4.94065645841247e-324;
              local_5b8._24_8_ = 4.94065645841247e-324;
              *local_6b8.m_data = 0.3;
              local_5b8._0_8_ = &local_6b8;
              this = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                               ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                local_5b8,&std_radphi);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (this,&std_radrd);
              if ((local_5b8._24_8_ + local_5b8._8_8_ == *(DenseIndex *)(local_5b8._0_8_ + 8)) &&
                 ((double)local_5b8._16_8_ == 4.94065645841247e-324)) {
                Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_6c8,2,2,1);
                local_5b8._8_8_ = 0.0;
                local_5b8._16_8_ = 4.94065645841247e-324;
                local_5b8._24_8_ = 4.94065645841247e-324;
                *local_6c8.m_data = 0.15;
                local_5b8._0_8_ = &local_6c8;
                Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_5b8,
                           &std_laspx);
                if ((local_5b8._24_8_ + local_5b8._8_8_ == *(DenseIndex *)(local_5b8._0_8_ + 8)) &&
                   ((double)local_5b8._16_8_ == 4.94065645841247e-324)) {
                  this_00 = (Sensor *)operator_new(0x48);
                  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"R","");
                  RadarSensor::RadarSensor
                            ((RadarSensor *)this_00,&local_638,(VectorXd *)&local_6b8,
                             ukf_parameters.debug);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_638._M_dataplus._M_p != &local_638.field_2) {
                    operator_delete(local_638._M_dataplus._M_p);
                  }
                  this_01 = (Sensor *)operator_new(0x48);
                  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"L","");
                  LidarSensor::LidarSensor
                            ((LidarSensor *)this_01,&local_658,(VectorXd *)&local_6c8,
                             ukf_parameters.debug);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_658._M_dataplus._M_p != &local_658.field_2) {
                    operator_delete(local_658._M_dataplus._M_p);
                  }
                  local_618._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_618._M_impl.super__Rb_tree_header._M_header;
                  local_618._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  local_618._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_618._M_impl.super__Rb_tree_header._M_node_count = 0;
                  local_618._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_618._M_impl.super__Rb_tree_header._M_header._M_left;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Sensors: ",9);
                  if (use_lidar == true) {
                    ppSVar7 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                                            *)&local_618,&this_01->name_);
                    *ppSVar7 = this_01;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Lidar ",6);
                  }
                  if (use_radar == true) {
                    ppSVar7 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                                            *)&local_618,&this_00->name_);
                    *ppSVar7 = this_00;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Radar",5);
                  }
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                  std::ostream::put(-0x30);
                  std::ostream::flush();
                  if (1 < ukf_parameters.debug) {
                    if (use_radar == true) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Radar covariance:\n",0x12);
                      pDVar8 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                               Sensor::GetR(this_00);
                      poVar5 = Eigen::operator<<((ostream *)&std::cout,pDVar8);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5)
                      ;
                      std::ostream::put((char)poVar5);
                      std::ostream::flush();
                    }
                    if (use_lidar == true) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Lidar covariance:\n",0x12);
                      pDVar8 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                               Sensor::GetR(this_01);
                      poVar5 = Eigen::operator<<((ostream *)&std::cout,pDVar8);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5)
                      ;
                      std::ostream::put((char)poVar5);
                      std::ostream::flush();
                    }
                  }
                  this_02 = MeasurementFactory::GetInstance();
                  local_6e8.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (Measurement **)0x0;
                  local_6e8.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (Measurement **)0x0;
                  local_6e8.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (Measurement **)0x0;
                  local_6a8 = local_698;
                  local_6a0 = 0;
                  local_698[0] = 0;
                  while( true ) {
                    cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                            (char)(istream *)local_238);
                    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                       ((istream *)local_238,(string *)&local_6a8,cVar3);
                    if ((((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) ||
                       (n_meas == 0)) break;
                    std::__cxx11::istringstream::istringstream
                              ((istringstream *)local_5b8,(string *)&local_6a8,_S_in);
                    local_6f8[0]._vptr_Tools =
                         (_func_int **)
                         MeasurementFactory::CreateMeasurement
                                   (this_02,(istringstream *)local_5b8,(SensorContainer *)&local_618
                                   );
                    if ((Measurement *)local_6f8[0]._vptr_Tools != (Measurement *)0x0) {
                      if (local_6e8.
                          super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_6e8.
                          super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<Measurement*,std::allocator<Measurement*>>::
                        _M_realloc_insert<Measurement*const&>
                                  ((vector<Measurement*,std::allocator<Measurement*>> *)&local_6e8,
                                   (iterator)
                                   local_6e8.
                                   super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (Measurement **)local_6f8);
                      }
                      else {
                        *local_6e8.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish =
                             (Measurement *)local_6f8[0]._vptr_Tools;
                        local_6e8.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_6e8.
                             super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 1;
                      }
                      n_meas = n_meas + -1;
                    }
                    std::__cxx11::istringstream::~istringstream((istringstream *)local_5b8);
                    std::ios_base::~ios_base((ios_base *)(local_5b8 + 0x78));
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Number of measurements: ",0x18);
                  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                  std::ostream::put((char)poVar5);
                  std::ostream::flush();
                  std::ifstream::close();
                  UnscentedKalmanFilter::UnscentedKalmanFilter
                            ((UnscentedKalmanFilter *)local_5b8,&ukf_parameters);
                  if (local_6e8.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      local_6e8.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    iVar4 = 0;
                    ppMVar10 = local_6e8.
                               super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                    do {
                      m_00 = *ppMVar10;
                      if (ukf_parameters.debug != 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"--- START MEASUREMENT: ",0x17);
                        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5," -------------------------------",0x20);
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) +
                                        (char)poVar5);
                        std::ostream::put((char)poVar5);
                        std::ostream::flush();
                      }
                      UnscentedKalmanFilter::ProcessMeasurement
                                ((UnscentedKalmanFilter *)local_5b8,m_00);
                      if (local_5b8[0x50] == true) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"Filter restarted at measurement ",0x20);
                        plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
                        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
                        std::ostream::put((char)plVar6);
                        std::ostream::flush();
                      }
                      operator<<((ostream *)&local_438,m_00);
                      ppMVar10 = ppMVar10 + 1;
                      iVar4 = iVar4 + 1;
                    } while (ppMVar10 !=
                             local_6e8.
                             super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
                  }
                  std::ofstream::close();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Accuracy - RMSE:",0x10);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                  std::ostream::put(-0x30);
                  poVar5 = (ostream *)std::ostream::flush();
                  std::vector<Measurement_*,_std::allocator<Measurement_*>_>::vector
                            (&local_670,&local_6e8);
                  Tools::CalculateRMSE(local_6f8,&local_670);
                  poVar5 = Eigen::operator<<(poVar5,(
                                                  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  *)local_6f8);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                  std::ostream::put((char)poVar5);
                  std::ostream::flush();
                  free(local_6f8[0]._vptr_Tools);
                  if (local_670.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_670.
                                    super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Consistency - percentage above Chi^2(0.050):",
                             0x2c);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                  std::ostream::put(-0x30);
                  poVar5 = (ostream *)std::ostream::flush();
                  std::vector<Measurement_*,_std::allocator<Measurement_*>_>::vector
                            (&local_688,&local_6e8);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                  ::_Rb_tree(&local_5e8,&local_618);
                  Tools::CheckConsistency(local_6f8,&local_688,(SensorContainer *)&local_5e8);
                  poVar5 = Eigen::operator<<(poVar5,(
                                                  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  *)local_6f8);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                  std::ostream::put((char)poVar5);
                  std::ostream::flush();
                  free(local_6f8[0]._vptr_Tools);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                  ::~_Rb_tree(&local_5e8);
                  if (local_688.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_688.
                                    super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Done!",5);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                  std::ostream::put(-0x30);
                  std::ostream::flush();
                  UnscentedKalmanFilter::~UnscentedKalmanFilter((UnscentedKalmanFilter *)local_5b8);
                  if (local_6a8 != local_698) {
                    operator_delete(local_6a8);
                  }
                  if (local_6e8.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                      _M_impl.super__Vector_impl_data._M_start != (Measurement **)0x0) {
                    operator_delete(local_6e8.
                                    super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                  ::~_Rb_tree(&local_618);
                  free(local_6c8.m_data);
                  free(local_6b8.m_data);
                  local_438 = _VTT;
                  *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
                  std::filebuf::~filebuf(local_430);
                  std::ios_base::~ios_base(local_340);
                  std::ifstream::~ifstream(local_238);
                  return 0;
                }
              }
              __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CommaInitializer.h"
                            ,0x6f,
                            "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Cannot open output file: ",0x19);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,out_filename_abi_cxx11_._M_dataplus._M_p,
                                out_filename_abi_cxx11_._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          goto LAB_00131de1;
        }
      }
    case 99:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6d:
    case 0x6f:
    case 0x71:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
      usage();
LAB_00131de1:
      exit(1);
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {

  parse_arguments(argc, argv, ukf_parameters);
  ifstream in_file(in_filename.c_str(), ifstream::in);
  ofstream out_file(out_filename.c_str(), ofstream::out);
  check_and_open_files(in_file, in_filename, out_file, out_filename);

  // Initialize covariance matrices of sensors
  VectorXd radar_noise(3);
  radar_noise << std_radr, std_radphi, std_radrd;
  VectorXd lidar_noise(2);
  lidar_noise << std_laspy, std_laspx;

  // Create sensor instances
  Sensor *radar = new RadarSensor("R", radar_noise, ukf_parameters.debug); 
  Sensor *lidar = new LidarSensor("L", lidar_noise, ukf_parameters.debug); 

  // Create sensor collection
  //
  // If a sensor is flagged out, its not included in sensor collection
  // and all measurements of the sensor are discarded.
  SensorContainer sensors;
  std::cout << "Sensors: ";
  if (use_lidar) {
      sensors[lidar->name_] = lidar;
      std::cout << "Lidar ";
  }
  if (use_radar) {
      sensors[radar->name_] = radar;
      std::cout << "Radar";  
  }
  std::cout << std::endl;

  if (ukf_parameters.debug>1) {
      if (use_radar) cout << "Radar covariance:\n" << radar->GetR() << endl;  
      if (use_lidar) cout << "Lidar covariance:\n" << lidar->GetR() << endl;  
  }

  // Get measurement factory
  MeasurementFactory* mf = MeasurementFactory::GetInstance();

  MeasurementContainer measurements;
  string line;

  // Read input file and fill measurement container
  while (getline(in_file, line) && n_meas != 0) {
    Measurement *m;
    istringstream iss(line);

    // Create measurement from input line, and store it to container
    // measurement is only created, if corresponding sensor is present in sensor collection
    m = mf->CreateMeasurement(iss, sensors);
    if (m != 0) {
        measurements.push_back(m);
        n_meas--;
    }
  }
  std::cout << "Number of measurements: " << measurements.size() << std::endl;
  in_file.close();

  // Create a filter instance
  UnscentedKalmanFilter ukf(ukf_parameters);

  // Run measurement through the filter and get estimations
  MeasurementContainer::iterator it;
  int i;
  for(it=measurements.begin(), i=0; it!=measurements.end(); it++, i++) {

    Measurement *m = *it;
    if (ukf_parameters.debug)
        std::cout << "--- START MEASUREMENT: " << i << " -------------------------------" << std::endl;

    ukf.ProcessMeasurement(m);

    if (ukf.restart_)
        std::cout << "Filter restarted at measurement " << i << std::endl;

    out_file << *m; // output estimate 
  }
  out_file.close();


  // Calculate accuracy and check consistency
  // - print out results
  cout << "Accuracy - RMSE:" << endl << Tools::CalculateRMSE(measurements) << endl;
  cout << "Consistency - percentage above Chi^2(0.050):" << endl << Tools::CheckConsistency(measurements, sensors) << endl;
  
  cout << "Done!" << endl;
  return 0;
}